

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_record.c
# Opt level: O0

int check_downrec_unroll(jit_State *J,GCproto *pt)

{
  ushort uVar1;
  uint local_2c;
  int local_28;
  IRRef ref;
  int count;
  IRRef ptref;
  GCproto *pt_local;
  jit_State *J_local;
  
  uVar1 = J->chain[0x18];
  do {
    ref = (IRRef)uVar1;
    if (ref == 0) {
      return 0;
    }
    if ((J->cur).ir[(ulong)ref + 1] == (IRIns)pt) {
      local_28 = 0;
      uVar1 = J->chain[0xb];
      while (local_2c = (uint)uVar1, local_2c != 0) {
        if ((J->cur).ir[local_2c].field_0.op1 == ref) {
          local_28 = local_28 + 1;
        }
        uVar1 = *(ushort *)((long)(J->cur).ir + (ulong)local_2c * 8 + 6);
      }
      if (local_28 != 0) {
        if (J->pc != J->startpc) {
          lj_trace_err(J,LJ_TRERR_DOWNREC);
        }
        if (J->param[0xc] < local_28 + J->tailcalled) {
          return 1;
        }
      }
    }
    uVar1 = *(ushort *)((long)(J->cur).ir + (ulong)ref * 8 + 6);
  } while( true );
}

Assistant:

static int check_downrec_unroll(jit_State *J, GCproto *pt)
{
  IRRef ptref;
  for (ptref = J->chain[IR_KGC]; ptref; ptref = IR(ptref)->prev)
    if (ir_kgc(IR(ptref)) == obj2gco(pt)) {
      int count = 0;
      IRRef ref;
      for (ref = J->chain[IR_RETF]; ref; ref = IR(ref)->prev)
	if (IR(ref)->op1 == ptref)
	  count++;
      if (count) {
	if (J->pc == J->startpc) {
	  if (count + J->tailcalled > J->param[JIT_P_recunroll])
	    return 1;
	} else {
	  lj_trace_err(J, LJ_TRERR_DOWNREC);
	}
      }
    }
  return 0;
}